

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::
SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
::emplace_back<unsigned_int&,unsigned_int&>
          (SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
           *this,uint *ts,uint *ts_1)

{
  long lVar1;
  long lVar2;
  
  SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
  ::reserve((SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
             *)this,*(long *)(this + 8) + 1);
  lVar1 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  *(uint *)(lVar1 + lVar2 * 8) = *ts;
  *(uint *)(lVar1 + 4 + lVar2 * 8) = *ts_1;
  *(long *)(this + 8) = lVar2 + 1;
  return;
}

Assistant:

void emplace_back(Ts &&... ts) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::forward<Ts>(ts)...);
		this->buffer_size++;
	}